

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O1

REF_STATUS ref_histogram_gather(REF_HISTOGRAM ref_histogram,REF_MPI ref_mpi)

{
  REF_INT *pRVar1;
  uint uVar2;
  int iVar3;
  void *output;
  long lVar4;
  ulong uVar5;
  REF_DBL log_total;
  REF_DBL max;
  REF_DBL min;
  double local_40;
  REF_DBL local_38;
  REF_DBL local_30;
  
  iVar3 = ref_histogram->nbin;
  if ((long)iVar3 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x79,"ref_histogram_gather","malloc bins of REF_INT negative");
    uVar2 = 1;
  }
  else {
    output = malloc((long)iVar3 * 4);
    if (output == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x79,"ref_histogram_gather","malloc bins of REF_INT NULL");
      uVar2 = 2;
    }
    else {
      uVar2 = ref_mpi_sum(ref_mpi,ref_histogram->bins,output,iVar3,1);
      if (uVar2 == 0) {
        uVar2 = ref_mpi_max(ref_mpi,ref_histogram,&local_38,3);
        if (uVar2 == 0) {
          uVar2 = ref_mpi_min(ref_mpi,&ref_histogram->min,&local_30,3);
          if (uVar2 == 0) {
            uVar2 = ref_mpi_sum(ref_mpi,&ref_histogram->log_total,&local_40,1,3);
            if (uVar2 == 0) {
              if (ref_mpi->id == 0) {
                ref_histogram->max = local_38;
                ref_histogram->min = local_30;
                ref_histogram->log_total = local_40;
                uVar2 = ref_histogram->nbin;
                if (0 < (int)uVar2) {
                  pRVar1 = ref_histogram->bins;
                  lVar4 = 0;
                  do {
                    pRVar1[lVar4] = *(REF_INT *)((long)output + lVar4 * 4);
                    lVar4 = lVar4 + 1;
                    uVar2 = ref_histogram->nbin;
                  } while (lVar4 < (int)uVar2);
                }
                if ((int)uVar2 < 1) {
                  iVar3 = 0;
                }
                else {
                  uVar5 = 0;
                  iVar3 = 0;
                  do {
                    iVar3 = iVar3 + ref_histogram->bins[uVar5];
                    uVar5 = uVar5 + 1;
                  } while (uVar2 != uVar5);
                }
                ref_histogram->log_mean = 0.0;
                if (0 < iVar3) {
                  ref_histogram->log_mean = local_40 / (double)iVar3;
                }
              }
              else {
                ref_histogram->max = -1e+20;
                ref_histogram->min = 1e+20;
                ref_histogram->log_total = 0.0;
                if (0 < ref_histogram->nbin) {
                  pRVar1 = ref_histogram->bins;
                  lVar4 = 0;
                  do {
                    pRVar1[lVar4] = 0;
                    lVar4 = lVar4 + 1;
                  } while (lVar4 < ref_histogram->nbin);
                }
                ref_histogram->log_mean = 0.0;
              }
              uVar2 = ref_mpi_bcast(ref_mpi,&ref_histogram->log_mean,1,3);
              if (uVar2 == 0) {
                free(output);
                uVar2 = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                       ,0x9f,"ref_histogram_gather",(ulong)uVar2,"log_mean");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                     ,0x86,"ref_histogram_gather",(ulong)uVar2,"log_total");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                   ,0x83,"ref_histogram_gather",(ulong)uVar2,"min");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x80,"ref_histogram_gather",(ulong)uVar2,"max");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
               ,0x7d,"ref_histogram_gather",(ulong)uVar2,"sum");
      }
    }
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_gather(REF_HISTOGRAM ref_histogram,
                                        REF_MPI ref_mpi) {
  REF_INT *bins;
  REF_DBL min, max, log_total;
  REF_INT i, observations;

  ref_malloc(bins, ref_histogram_nbin(ref_histogram), REF_INT);

  RSS(ref_mpi_sum(ref_mpi, ref_histogram->bins, bins,
                  ref_histogram_nbin(ref_histogram), REF_INT_TYPE),
      "sum");
  RSS(ref_mpi_max(ref_mpi, &ref_histogram_max(ref_histogram), &max,
                  REF_DBL_TYPE),
      "max");
  RSS(ref_mpi_min(ref_mpi, &ref_histogram_min(ref_histogram), &min,
                  REF_DBL_TYPE),
      "min");
  RSS(ref_mpi_sum(ref_mpi, &ref_histogram_log_total(ref_histogram), &log_total,
                  1, REF_DBL_TYPE),
      "log_total");

  if (ref_mpi_once(ref_mpi)) {
    ref_histogram_max(ref_histogram) = max;
    ref_histogram_min(ref_histogram) = min;
    ref_histogram_log_total(ref_histogram) = log_total;
    for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
      ref_histogram->bins[i] = bins[i];
    observations = 0;
    for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
      observations += ref_histogram->bins[i];
    ref_histogram_log_mean(ref_histogram) = 0.0;
    if (observations > 0)
      ref_histogram_log_mean(ref_histogram) = log_total / (REF_DBL)observations;
  } else {
    ref_histogram_max(ref_histogram) = -1.0e20;
    ref_histogram_min(ref_histogram) = 1.0e20;
    ref_histogram_log_total(ref_histogram) = 0.0;
    for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
      ref_histogram->bins[i] = 0;
    ref_histogram_log_mean(ref_histogram) = 0.0;
  }

  RSS(ref_mpi_bcast(ref_mpi, &ref_histogram_log_mean(ref_histogram), 1,
                    REF_DBL_TYPE),
      "log_mean");

  ref_free(bins);

  return REF_SUCCESS;
}